

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_palette.cpp
# Opt level: O1

ComparisonResult __thiscall ProtoPalette::compare(ProtoPalette *this,ProtoPalette *other)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  ComparisonResult CVar4;
  long lVar5;
  byte bVar6;
  long lVar7;
  
  lVar5 = 2;
  do {
    lVar7 = lVar5;
    if (lVar7 == 8) goto LAB_001120aa;
    lVar5 = lVar7 + 2;
  } while (*(ushort *)((long)(this->_colorIndices)._M_elems + lVar7 + -2) <=
           *(ushort *)((long)(this->_colorIndices)._M_elems + lVar7));
  if (lVar7 != 8) {
    __assert_fail("std::is_sorted(_colorIndices.begin(), _colorIndices.end())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/proto_palette.cpp"
                  ,0x2d,
                  "ProtoPalette::ComparisonResult ProtoPalette::compare(const ProtoPalette &) const"
                 );
  }
LAB_001120aa:
  lVar5 = 2;
  do {
    lVar7 = lVar5;
    if (lVar7 == 8) goto LAB_001120d1;
    lVar5 = lVar7 + 2;
  } while (*(ushort *)((long)(other->_colorIndices)._M_elems + lVar7 + -2) <=
           *(ushort *)((long)(other->_colorIndices)._M_elems + lVar7));
  if (lVar7 != 8) {
    __assert_fail("std::is_sorted(other._colorIndices.begin(), other._colorIndices.end())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/proto_palette.cpp"
                  ,0x2e,
                  "ProtoPalette::ComparisonResult ProtoPalette::compare(const ProtoPalette &) const"
                 );
  }
LAB_001120d1:
  bVar3 = true;
  lVar5 = 0;
  bVar6 = 1;
  lVar7 = 0;
  do {
    uVar1 = *(ushort *)((long)(other->_colorIndices)._M_elems + lVar5);
    uVar2 = *(ushort *)((long)(this->_colorIndices)._M_elems + lVar7);
    if (uVar2 == uVar1) {
      lVar7 = lVar7 + 2;
      lVar5 = lVar5 + 2;
    }
    else if (uVar2 < uVar1) {
      lVar7 = lVar7 + 2;
      bVar3 = false;
    }
    else {
      lVar5 = lVar5 + 2;
      bVar6 = 0;
    }
  } while ((lVar7 != 8) && (lVar5 != 8));
  CVar4 = THEY_BIGGER;
  if (!bVar3 || lVar7 != 8) {
    CVar4 = (ComparisonResult)(lVar5 == 8 & bVar6);
  }
  return CVar4;
}

Assistant:

ProtoPalette::ComparisonResult ProtoPalette::compare(ProtoPalette const &other) const {
	// This works because the sets are sorted numerically
	assert(std::is_sorted(_colorIndices.begin(), _colorIndices.end()));
	assert(std::is_sorted(other._colorIndices.begin(), other._colorIndices.end()));

	auto ours = _colorIndices.begin(), theirs = other._colorIndices.begin();
	bool weBigger = true, theyBigger = true;

	while (ours != _colorIndices.end() && theirs != other._colorIndices.end()) {
		if (*ours == *theirs) {
			++ours;
			++theirs;
		} else if (*ours < *theirs) {
			++ours;
			theyBigger = false;
		} else { // *ours > *theirs
			++theirs;
			weBigger = false;
		}
	}
	weBigger &= theirs == other._colorIndices.end();
	theyBigger &= ours == _colorIndices.end();

	return theyBigger ? THEY_BIGGER : (weBigger ? WE_BIGGER : NEITHER);
}